

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O3

unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
__thiscall
jsoncons::jsonpath::detail::
static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
get_regex_operator(static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *this,basic_regex<char,_std::__cxx11::regex_traits<char>_> *pattern)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  tuple<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  tVar3;
  pointer __p;
  __uniq_ptr_impl<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  local_30;
  _Head_base<0UL,_jsoncons::jsonpath::detail::regex_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
  local_28;
  
  tVar3.
  super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        )operator_new(0x38);
  *(long *)((long)tVar3.
                  super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  .
                  super__Head_base<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
                  ._M_head_impl + 8) = 2;
  *(undefined1 *)
   ((long)tVar3.
          super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          .
          super__Head_base<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
          ._M_head_impl + 0x10) = 1;
  *(undefined ***)
   tVar3.
   super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
   .
   super__Head_base<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
   ._M_head_impl = &PTR__regex_operator_00b384e8;
  *(flag_type *)
   ((long)tVar3.
          super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          .
          super__Head_base<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
          ._M_head_impl + 0x18) = pattern->_M_flags;
  std::locale::locale((locale *)
                      ((long)tVar3.
                             super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                             .
                             super__Head_base<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
                             ._M_head_impl + 0x20),&pattern->_M_loc);
  peVar1 = (pattern->_M_automaton).
           super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var2 = (pattern->_M_automaton).
           super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (pattern->_M_automaton).
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)
   ((long)tVar3.
          super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          .
          super__Head_base<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
          ._M_head_impl + 0x28) = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((long)tVar3.
          super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          .
          super__Head_base<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
          ._M_head_impl + 0x30) = p_Var2;
  (pattern->_M_automaton).
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_28._M_head_impl =
       (regex_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        *)0x0;
  local_30._M_t.
  super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (tuple<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        )(tuple<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          )tVar3.
           super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           .
           super__Head_base<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
           ._M_head_impl;
  std::
  vector<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
  ::
  emplace_back<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((vector<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
              *)&this->unary_operators_,
             (unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)&local_30);
  if ((_Tuple_impl<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
       )local_30._M_t.
        super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        .
        super__Head_base<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
        ._M_head_impl !=
      (unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
      )0x0) {
    (**(code **)(*(long *)local_30._M_t.
                          super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                          .
                          super__Head_base<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  local_30._M_t.
  super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (tuple<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        )(_Tuple_impl<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          )0x0;
  std::
  unique_ptr<jsoncons::jsonpath::detail::regex_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::regex_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  ::~unique_ptr((unique_ptr<jsoncons::jsonpath::detail::regex_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::regex_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)&local_28);
  return (this->unary_operators_).
         super__Vector_base<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
         .
         super__Head_base<0UL,_jsoncons::jsonpath::detail::unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
         ._M_head_impl;
}

Assistant:

const unary_operator<Json>* get_regex_operator(std::basic_regex<char_type>&& pattern) 
        {
            unary_operators_.push_back(jsoncons::make_unique<regex_operator<Json>>(std::move(pattern)));
            return unary_operators_.back().get();
        }